

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::~StreamingReporterBase
          (StreamingReporterBase<Catch::CompactReporter> *this)

{
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__StreamingReporterBase_0024cee0;
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&this->m_sectionStack);
  Option<Catch::TestCaseInfo>::reset(&(this->currentTestCaseInfo).super_Option<Catch::TestCaseInfo>)
  ;
  Option<Catch::GroupInfo>::reset(&(this->currentGroupInfo).super_Option<Catch::GroupInfo>);
  Option<Catch::TestRunInfo>::reset(&(this->currentTestRunInfo).super_Option<Catch::TestRunInfo>);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~StreamingReporterBase() override = default;